

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
MuteIRCCommand::trigger
          (MuteIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  PlayerInfo *pPVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  undefined8 args_1;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  
  pcVar7 = nick._M_str;
  sVar6 = nick._M_len;
  pbVar5 = (basic_string_view<char,_std::char_traits<char>_> *)channel._M_str;
  if (parameters._M_len != 0) {
    args_1 = pbVar5;
    lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,pbVar5);
    if (lVar2 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      uVar8 = 0;
      bVar9 = false;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if (uVar3 == uVar8) break;
        uVar3 = RenX::getCore();
        pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)pPVar4);
        if (cVar1 != '\0') {
          lVar2 = RenX::Server::getPlayerByPartName(pPVar4,parameters._M_len,parameters._M_str);
          if (lVar2 == 0) {
            args_1 = (basic_string_view<char,_std::char_traits<char>_> *)0x18;
            Jupiter::IRC::Client::sendNotice(source,sVar6,pcVar7,0x18,"Error: Player not found.");
          }
          else {
            RenX::Server::mute(pPVar4);
            RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&stack0xffffffffffffffb0);
            local_80._0_8_ = (pointer)0x11;
            local_80._8_8_ = "\x03 has been muted.";
            jessilib::
            join<std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_80 + 0x10),(jessilib *)&stack0xffffffffffffffb0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,(basic_string_view<char,_std::char_traits<char>_> *)args_1);
            args_1 = local_70[0]._8_8_;
            Jupiter::IRC::Client::sendMessage
                      (source,channel._M_len,pbVar5,local_70[0]._8_8_,
                       local_70[0]._M_allocated_capacity);
            std::__cxx11::string::~string((string *)(local_80 + 0x10));
            std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
          }
          bVar9 = true;
        }
        uVar8 = uVar8 + 1;
      }
      if (!bVar9) {
        Jupiter::IRC::Client::sendNotice
                  (source,sVar6,pcVar7,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
    }
    return;
  }
  Jupiter::IRC::Client::sendNotice
            (source,sVar6,pcVar7,0x30,"Error: Too Few Parameters. Syntax: mute <player>");
  return;
}

Assistant:

void MuteIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			int type = chan->getType();
			RenX::PlayerInfo *player;
			bool match = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					match = true;
					player = server->getPlayerByPartName(parameters);
					if (player != nullptr)
					{
						server->mute(*player);
						source->sendMessage(channel, jessilib::join<std::string>(RenX::getFormattedPlayerName(*player), IRCCOLOR " has been muted."sv));
					}
					else
						source->sendNotice(nick, "Error: Player not found."sv);
				}
			}
			if (match == false)
				source->sendNotice(nick, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: mute <player>"sv);
}